

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O1

int __thiscall despot::Planner::RunEvaluation(Planner *this,int argc,char **argv)

{
  string world_type_00;
  string solver_type_00;
  int iVar1;
  Option *options;
  clock_t cVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Belief *belief;
  Solver *solver_00;
  undefined8 in_stack_fffffffffffffe88;
  int num_runs;
  bool search_solver;
  Logger *logger;
  undefined4 uStack_160;
  int time_limit;
  Belief *local_158;
  World *local_150;
  string belief_type;
  string world_type;
  string solver_type;
  long *local_e8 [2];
  long local_d8 [2];
  ulong local_c8;
  clock_t local_c0;
  long *local_b8 [2];
  long local_a8 [2];
  Solver *solver;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  DSPOMDP *model;
  undefined4 extraout_var_02;
  
  (*(this->super_PlannerBase)._vptr_PlannerBase[5])(&solver_type,this);
  num_runs = 1;
  world_type._M_dataplus._M_p = (pointer)&world_type.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&world_type,"pomdp","");
  belief_type._M_dataplus._M_p = (pointer)&belief_type.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&belief_type,"DEFAULT","");
  time_limit = -1;
  options = PlannerBase::InitializeParamers
                      (&this->super_PlannerBase,argc,argv,&solver_type,&search_solver,&num_runs,
                       &world_type,&belief_type,&time_limit);
  if (options != (Option *)0x0) {
    cVar2 = clock();
    iVar1 = (*(this->super_PlannerBase)._vptr_PlannerBase[2])(this,options);
    model = (DSPOMDP *)CONCAT44(extraout_var,iVar1);
    if (model == (DSPOMDP *)0x0) {
      __assert_fail("model != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/evaluator.cpp"
                    ,0x4d,"virtual int despot::Planner::RunEvaluation(int, char **)");
    }
    iVar1 = (*(this->super_PlannerBase)._vptr_PlannerBase[3])(this,&world_type,model,options);
    local_150 = (World *)CONCAT44(extraout_var_00,iVar1);
    if (local_150 == (World *)0x0) {
      __assert_fail("world != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/evaluator.cpp"
                    ,0x53,"virtual int despot::Planner::RunEvaluation(int, char **)");
    }
    iVar1 = (*local_150->_vptr_World[4])();
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_50,belief_type._M_dataplus._M_p,
               belief_type._M_dataplus._M_p + belief_type._M_string_length);
    iVar1 = (*model->_vptr_DSPOMDP[9])(model,CONCAT44(extraout_var_01,iVar1),local_50);
    belief = (Belief *)CONCAT44(extraout_var_02,iVar1);
    if (local_50[0] != local_40) {
      operator_delete(local_50[0],local_40[0] + 1);
    }
    if (belief == (Belief *)0x0) {
      __assert_fail("belief != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/AdaCompNUS[P]despot/src/evaluator.cpp"
                    ,0x59,"virtual int despot::Planner::RunEvaluation(int, char **)");
    }
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,solver_type._M_dataplus._M_p,
               solver_type._M_dataplus._M_p + solver_type._M_string_length);
    local_158 = belief;
    solver_00 = PlannerBase::InitializeSolver
                          (&this->super_PlannerBase,model,belief,&local_70,options);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    logger = (Logger *)0x0;
    local_c8 = (ulong)(uint)num_runs;
    local_e8[0] = local_d8;
    local_c0 = cVar2;
    solver = solver_00;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e8,world_type._M_dataplus._M_p,
               world_type._M_dataplus._M_p + world_type._M_string_length);
    iVar1 = time_limit;
    local_b8[0] = local_a8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b8,solver_type._M_dataplus._M_p,
               solver_type._M_dataplus._M_p + solver_type._M_string_length);
    cVar2 = local_c0;
    world_type_00._M_string_length._0_4_ = iVar1;
    world_type_00._M_dataplus._M_p = (pointer)local_e8;
    world_type_00._M_string_length._4_4_ = 0;
    world_type_00.field_2._M_allocated_capacity = (size_type)local_b8;
    world_type_00.field_2._8_8_ = in_stack_fffffffffffffe88;
    solver_type_00._M_string_length._0_4_ = uStack_160;
    solver_type_00._M_dataplus._M_p = (pointer)logger;
    solver_type_00._M_string_length._4_4_ = time_limit;
    solver_type_00.field_2._M_allocated_capacity = (size_type)local_158;
    solver_type_00.field_2._8_8_ = local_150;
    PlannerBase::InitializeLogger
              (&this->super_PlannerBase,&logger,options,model,local_158,solver_00,(int)local_c8,
               local_c0,local_150,world_type_00,num_runs,solver_type_00);
    if (local_b8[0] != local_a8) {
      operator_delete(local_b8[0],local_a8[0] + 1);
    }
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0],local_d8[0] + 1);
    }
    PlannerBase::DisplayParameters(&this->super_PlannerBase,options,model);
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,belief_type._M_dataplus._M_p,
               belief_type._M_dataplus._M_p + belief_type._M_string_length);
    (*(this->super_PlannerBase)._vptr_PlannerBase[10])
              (this,model,local_150,local_158,local_90,&solver,logger,options,cVar2,
               (ulong)(uint)num_runs,0);
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    PlannerBase::PrintResult(&this->super_PlannerBase,num_runs,logger,cVar2);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)belief_type._M_dataplus._M_p != &belief_type.field_2) {
    operator_delete(belief_type._M_dataplus._M_p,belief_type.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)world_type._M_dataplus._M_p != &world_type.field_2) {
    operator_delete(world_type._M_dataplus._M_p,world_type.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)solver_type._M_dataplus._M_p != &solver_type.field_2) {
    operator_delete(solver_type._M_dataplus._M_p,solver_type.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int Planner::RunEvaluation(int argc, char *argv[]) {

	/* =========================
	 * initialize parameters
	 * =========================*/
	string solver_type = ChooseSolver();
	bool search_solver;
	int num_runs = 1;
	string world_type = "pomdp";
	string belief_type = "DEFAULT";
	int time_limit = -1;

	option::Option *options = InitializeParamers(argc, argv, solver_type,
			search_solver, num_runs, world_type, belief_type, time_limit);
	if(options==NULL)
		return 0;
	clock_t main_clock_start = clock();

	/* =========================
	 * initialize model
	 * =========================*/
	DSPOMDP *model = InitializeModel(options);
	assert(model != NULL);

	/* =========================
	 * initialize world
	 * =========================*/
	World *world = InitializeWorld(world_type, model, options);
	assert(world != NULL);

	/* =========================
	 * initialize belief
	 * =========================*/
	Belief* belief = model->InitialBelief(world->GetCurrentState(), belief_type);
	assert(belief != NULL);

	/* =========================
	 * initialize solver
	 * =========================*/
	Solver *solver = InitializeSolver(model, belief, solver_type, options);

	/* =========================
	 * initialize logger
	 * =========================*/
	Logger *logger = NULL;
	InitializeLogger(logger, options, model, belief, solver, num_runs,
			main_clock_start, world, world_type, time_limit, solver_type);
	//logger->world_seed(world_seed);

	int start_run = 0;

	/* =========================
	 * Display parameters
	 * =========================*/
	DisplayParameters(options, model);

	/* =========================
	 * run evaluation
	 * =========================*/
	EvaluationLoop(model, world, belief, belief_type, solver, logger,
			options, main_clock_start, num_runs, start_run);

	//logger->End();

	PrintResult(num_runs, logger, main_clock_start);

	return 0;
}